

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.c
# Opt level: O1

int libssh2_channel_get_exit_signal
              (LIBSSH2_CHANNEL *channel,char **exitsignal,size_t *exitsignal_len,char **errmsg,
              size_t *errmsg_len,char **langtag,size_t *langtag_len)

{
  LIBSSH2_SESSION *session;
  bool bVar1;
  uint uVar2;
  size_t __n;
  char *__dest;
  
  if (channel == (LIBSSH2_CHANNEL *)0x0) {
    return 0;
  }
  if (channel->exit_signal == (char *)0x0) {
    if (exitsignal != (char **)0x0) {
      *exitsignal = (char *)0x0;
    }
    if (exitsignal_len != (size_t *)0x0) {
      __n = 0;
      goto LAB_0011d8cb;
    }
  }
  else {
    session = channel->session;
    __n = strlen(channel->exit_signal);
    if (exitsignal != (char **)0x0) {
      __dest = (char *)(*session->alloc)(__n + 1,&session->abstract);
      *exitsignal = __dest;
      if (__dest == (char *)0x0) {
        uVar2 = _libssh2_error(session,-6,"Unable to allocate memory for signal name");
        langtag_len = (size_t *)(ulong)uVar2;
        bVar1 = false;
        goto LAB_0011d906;
      }
      memcpy(__dest,channel->exit_signal,__n);
      (*exitsignal)[__n] = '\0';
    }
    if (exitsignal_len != (size_t *)0x0) {
LAB_0011d8cb:
      *exitsignal_len = __n;
    }
  }
  if (errmsg != (char **)0x0) {
    *errmsg = (char *)0x0;
  }
  if (errmsg_len != (size_t *)0x0) {
    *errmsg_len = 0;
  }
  if (langtag != (char **)0x0) {
    *langtag = (char *)0x0;
  }
  bVar1 = true;
  if (langtag_len != (size_t *)0x0) {
    *langtag_len = 0;
  }
LAB_0011d906:
  if (bVar1) {
    return 0;
  }
  return (int)langtag_len;
}

Assistant:

LIBSSH2_API int
libssh2_channel_get_exit_signal(LIBSSH2_CHANNEL *channel,
                                char **exitsignal,
                                size_t *exitsignal_len,
                                char **errmsg,
                                size_t *errmsg_len,
                                char **langtag,
                                size_t *langtag_len)
{
    size_t namelen = 0;

    if(channel) {
        LIBSSH2_SESSION *session = channel->session;

        if(channel->exit_signal) {
            namelen = strlen(channel->exit_signal);
            if(exitsignal) {
                *exitsignal = LIBSSH2_ALLOC(session, namelen + 1);
                if(!*exitsignal) {
                    return _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                                  "Unable to allocate memory for signal name");
                }
                memcpy(*exitsignal, channel->exit_signal, namelen);
                (*exitsignal)[namelen] = '\0';
            }
            if(exitsignal_len)
                *exitsignal_len = namelen;
        }
        else {
            if(exitsignal)
                *exitsignal = NULL;
            if(exitsignal_len)
                *exitsignal_len = 0;
        }

        /* TODO: set error message and language tag */

        if(errmsg)
            *errmsg = NULL;

        if(errmsg_len)
            *errmsg_len = 0;

        if(langtag)
            *langtag = NULL;

        if(langtag_len)
            *langtag_len = 0;
    }

    return LIBSSH2_ERROR_NONE;
}